

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::ByteCodeWriter::TryWriteCallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (ByteCodeWriter *this,OpCode op,RegSlot returnValueRegister,RegSlot functionRegister,
          ArgSlot givenArgCount)

{
  bool bVar1;
  uchar local_2b;
  short sStack_2a;
  unsigned_short uStack_28;
  ArgSlot local_26;
  undefined1 uStack_24;
  OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  ArgSlot givenArgCount_local;
  RegSlot functionRegister_local;
  RegSlot returnValueRegister_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  local_26 = givenArgCount;
  _uStack_24 = functionRegister;
  unique0x10000091 = returnValueRegister;
  bVar1 = LayoutSizePolicy<(Js::LayoutSize)1>::Assign<short,unsigned_int>
                    (&sStack_2a,returnValueRegister);
  if (((bVar1) &&
      (bVar1 = LayoutSizePolicy<(Js::LayoutSize)1>::Assign<unsigned_short,unsigned_int>
                         (&uStack_28,_uStack_24), bVar1)) &&
     (bVar1 = LayoutSizePolicy<(Js::LayoutSize)1>::Assign<unsigned_char,unsigned_short>
                        (&local_2b,local_26), bVar1)) {
    Data::EncodeT<(Js::LayoutSize)1>(&this->m_byteCodeData,op,&local_2b,5,this);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ByteCodeWriter::TryWriteCallI(OpCode op, RegSlot returnValueRegister, RegSlot functionRegister, ArgSlot givenArgCount)
    {
        OpLayoutT_CallI<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Return, returnValueRegister) && SizePolicy::Assign(layout.Function, functionRegister)
            && SizePolicy::Assign(layout.ArgCount, givenArgCount))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }